

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uchar * lodepng_chunk_next_const(uchar *chunk,uchar *end)

{
  byte bVar1;
  
  if (0xb < (long)end - (long)chunk && chunk < end) {
    bVar1 = chunk[1];
    if ((((bVar1 == 0x50 && *chunk == 0x89) && (bVar1 = 0x50, chunk[2] == 'N')) && (chunk[3] == 'G')
        ) && (((chunk[4] == '\r' && (chunk[5] == '\n')) &&
              ((chunk[6] == '\x1a' && (chunk[7] == '\n')))))) {
      return chunk + 8;
    }
    end = chunk + ((ulong)chunk[3] |
                  (ulong)((uint)chunk[2] << 8 | (uint)bVar1 << 0x10 | (uint)*chunk << 0x18)) + 0xc;
  }
  return end;
}

Assistant:

const unsigned char* lodepng_chunk_next_const(const unsigned char* chunk, const unsigned char* end) {
  if(chunk >= end || end - chunk < 12) return end; /*too small to contain a chunk*/
  if(chunk[0] == 0x89 && chunk[1] == 0x50 && chunk[2] == 0x4e && chunk[3] == 0x47
    && chunk[4] == 0x0d && chunk[5] == 0x0a && chunk[6] == 0x1a && chunk[7] == 0x0a) {
    /* Is PNG magic header at start of PNG file. Jump to first actual chunk. */
    return chunk + 8;
  } else {
    size_t total_chunk_length;
    const unsigned char* result;
    if(lodepng_addofl(lodepng_chunk_length(chunk), 12, &total_chunk_length)) return end;
    result = chunk + total_chunk_length;
    if(result < chunk) return end; /*pointer overflow*/
    return result;
  }
}